

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Lodtalk::ASTInterpreter::ASTInterpreter
          (ASTInterpreter *this,InterpreterProxy *interpreter,EvaluationScopePtr *initialScope,
          Oop currentSelf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  VMContext *pVVar3;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  pVVar3 = (VMContext *)CONCAT44(extraout_var,iVar2);
  (this->super_ScopedInterpreter).super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR___cxa_pure_virtual_00163a50;
  (this->super_ScopedInterpreter).context = pVVar3;
  (this->super_ScopedInterpreter).currentScope.
  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (initialScope->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var1 = (initialScope->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->super_ScopedInterpreter).currentScope.
  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      pVVar3 = (this->super_ScopedInterpreter).context;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_ScopedInterpreter).super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitArgument_001637e8;
  this->interpreter = interpreter;
  (this->currentSelf).oop.field_0 = currentSelf.field_0;
  (this->currentSelf).context_ = pVVar3;
  OopRef::registerSelf(&this->currentSelf);
  return;
}

Assistant:

ASTInterpreter(InterpreterProxy *interpreter, const EvaluationScopePtr &initialScope, Oop currentSelf)
		: ScopedInterpreter(interpreter->getContext(), initialScope), interpreter(interpreter), currentSelf(context, currentSelf) {}